

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void bcemit_branch_t(FuncState *fs,ExpDesc *e)

{
  ExpKind EVar1;
  BCPos BVar2;
  
  expr_discharge(fs,e);
  EVar1 = e->k;
  BVar2 = 0xffffffff;
  if (2 < EVar1 - VKTRUE) {
    if (EVar1 < VKTRUE) {
      expr_toreg_nobranch(fs,e,0xff);
      BVar2 = bcemit_jmp(fs);
    }
    else if (EVar1 == VJMP) {
      *(byte *)&fs->bcbase[(e->u).s.info - 1].ins = (byte)fs->bcbase[(e->u).s.info - 1].ins ^ 1;
      BVar2 = (e->u).s.info;
    }
    else {
      BVar2 = bcemit_branch(fs,e,0);
    }
  }
  jmp_append(fs,&e->f,BVar2);
  BVar2 = e->t;
  fs->lasttarget = fs->pc;
  jmp_append(fs,&fs->jpc,BVar2);
  e->t = 0xffffffff;
  return;
}

Assistant:

static void bcemit_branch_t(FuncState *fs, ExpDesc *e)
{
  BCPos pc;
  expr_discharge(fs, e);
  if (e->k == VKSTR || e->k == VKNUM || e->k == VKTRUE)
    pc = NO_JMP;  /* Never jump. */
  else if (e->k == VJMP)
    invertcond(fs, e), pc = e->u.s.info;
  else if (e->k == VKFALSE || e->k == VKNIL)
    expr_toreg_nobranch(fs, e, NO_REG), pc = bcemit_jmp(fs);
  else
    pc = bcemit_branch(fs, e, 0);
  jmp_append(fs, &e->f, pc);
  jmp_tohere(fs, e->t);
  e->t = NO_JMP;
}